

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O0

void __thiscall
QHttpNetworkConnectionPrivate::fillPipeline(QHttpNetworkConnectionPrivate *this,QIODevice *socket)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  Operation OVar4;
  SocketState SVar5;
  int iVar6;
  qsizetype qVar7;
  QHttpNetworkConnectionChannel *pQVar8;
  QHttpNetworkConnectionPrivate *in_RSI;
  QIODevice *in_RDI;
  long in_FS_OFFSET;
  int lengthBefore;
  int i;
  QHttpNetworkConnectionChannel *in_stack_ffffffffffffff60;
  undefined2 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6a;
  undefined1 in_stack_ffffffffffffff6b;
  byte bVar9;
  undefined1 in_stack_ffffffffffffff6c;
  byte bVar10;
  undefined1 in_stack_ffffffffffffff6d;
  byte bVar11;
  byte in_stack_ffffffffffffff6e;
  byte bVar12;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::isEmpty
                    ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)0x2eeb9c);
  if ((((((!bVar2) ||
         (bVar2 = QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::isEmpty
                            ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)0x2eebb3
                            ), !bVar2)) &&
        (iVar3 = indexOf((QHttpNetworkConnectionPrivate *)
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),in_RDI),
        *(long *)(*(long *)(in_RDI + 0xb8) + (long)iVar3 * 0x108 + 0x38) != 0)) &&
       ((qVar7 = QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::size
                           ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                            (*(long *)(in_RDI + 0xb8) + (long)iVar3 * 0x108 + 0xb8)), 1 < 3 - qVar7
        && (*(int *)(*(long *)(in_RDI + 0xb8) + (long)iVar3 * 0x108 + 0xb0) == 1)))) &&
      ((bVar2 = QHttpNetworkRequest::isPipeliningAllowed((QHttpNetworkRequest *)0x2eec84), bVar2 &&
       ((OVar4 = QHttpNetworkRequest::operation((QHttpNetworkRequest *)0x2eecb1), OVar4 == Get &&
        (SVar5 = QSocketAbstraction::socketState((QIODevice *)in_stack_ffffffffffffff60),
        SVar5 == ConnectedState)))))) &&
     ((*(byte *)(*(long *)(in_RDI + 0xb8) + (long)iVar3 * 0x108 + 0x50) & 1) == 0)) {
    bVar2 = QAuthenticator::isNull
                      ((QAuthenticator *)(*(long *)(in_RDI + 0xb8) + (long)iVar3 * 0x108 + 0x60));
    bVar16 = 0;
    bVar15 = 0;
    bVar12 = 0;
    bVar11 = bVar12;
    if (!bVar2) {
      QAuthenticator::user
                ((QAuthenticator *)
                 (ulong)CONCAT16(in_stack_ffffffffffffff6e,
                                 CONCAT15(in_stack_ffffffffffffff6d,
                                          CONCAT14(in_stack_ffffffffffffff6c,
                                                   CONCAT13(in_stack_ffffffffffffff6b,
                                                            CONCAT12(in_stack_ffffffffffffff6a,
                                                                     in_stack_ffffffffffffff68))))))
      ;
      bVar16 = 1;
      bVar2 = QString::isEmpty((QString *)0x2eed72);
      in_stack_ffffffffffffff6e = 1;
      bVar11 = in_stack_ffffffffffffff6e;
      if (bVar2) {
        QAuthenticator::password
                  ((QAuthenticator *)
                   CONCAT17(bVar12,CONCAT16(1,CONCAT15(in_stack_ffffffffffffff6d,
                                                       CONCAT14(in_stack_ffffffffffffff6c,
                                                                CONCAT13(in_stack_ffffffffffffff6b,
                                                                         CONCAT12(
                                                  in_stack_ffffffffffffff6a,
                                                  in_stack_ffffffffffffff68)))))));
        bVar15 = 1;
        bVar2 = QString::isEmpty((QString *)0x2eedb9);
        in_stack_ffffffffffffff6e = bVar2 ^ 0xff;
        bVar11 = in_stack_ffffffffffffff6e;
      }
    }
    bVar12 = bVar11;
    if ((bVar15 & 1) != 0) {
      QString::~QString((QString *)0x2eede2);
    }
    if ((bVar16 & 1) != 0) {
      QString::~QString((QString *)0x2eedf8);
    }
    if ((bVar11 & 1) == 0) {
      bVar2 = QAuthenticator::isNull
                        ((QAuthenticator *)(*(long *)(in_RDI + 0xb8) + (long)iVar3 * 0x108 + 0x68));
      bVar14 = 0;
      bVar13 = 0;
      bVar10 = 0;
      bVar9 = bVar10;
      if (!bVar2) {
        QAuthenticator::user
                  ((QAuthenticator *)
                   CONCAT17(bVar12,CONCAT16(in_stack_ffffffffffffff6e,
                                            CONCAT15(bVar11,(uint5)CONCAT13(
                                                  in_stack_ffffffffffffff6b,
                                                  CONCAT12(in_stack_ffffffffffffff6a,
                                                           in_stack_ffffffffffffff68))))));
        bVar14 = 1;
        bVar2 = QString::isEmpty((QString *)0x2eee7e);
        bVar9 = 1;
        if (bVar2) {
          QAuthenticator::password
                    ((QAuthenticator *)
                     CONCAT17(bVar12,CONCAT16(in_stack_ffffffffffffff6e,
                                              CONCAT15(bVar11,CONCAT14(bVar10,CONCAT13(1,CONCAT12(
                                                  in_stack_ffffffffffffff6a,
                                                  in_stack_ffffffffffffff68)))))));
          bVar13 = 1;
          bVar2 = QString::isEmpty((QString *)0x2eeec5);
          bVar9 = bVar2 ^ 0xff;
        }
      }
      if ((bVar13 & 1) != 0) {
        QString::~QString((QString *)0x2eeeee);
      }
      if ((bVar14 & 1) != 0) {
        QString::~QString((QString *)0x2eef01);
      }
      if (((bVar9 & 1) == 0) &&
         ((*(int *)(*(long *)(in_RDI + 0xb8) + (long)iVar3 * 0x108 + 0x20) == 4 ||
          (*(int *)(*(long *)(in_RDI + 0xb8) + (long)iVar3 * 0x108 + 0x20) == 8)))) {
        do {
          bVar2 = QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::isEmpty
                            ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)0x2eef70
                            );
          if (((bVar2 ^ 0xffU) & 1) == 0) break;
          qVar7 = QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::size
                            ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                             (*(long *)(in_RDI + 0xb8) + (long)iVar3 * 0x108 + 0xb8));
          iVar6 = (int)qVar7;
          fillPipeline(in_RSI,(QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                              CONCAT44(iVar3,CONCAT13(bVar16,CONCAT12(bVar15,CONCAT11(bVar14,bVar13)
                                                                     ))),
                       (QHttpNetworkConnectionChannel *)CONCAT44(iVar6,in_stack_ffffffffffffff78));
          qVar7 = QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::size
                            ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                             (*(long *)(in_RDI + 0xb8) + (long)iVar3 * 0x108 + 0xb8));
          if (2 < qVar7) {
            QHttpNetworkConnectionChannel::pipelineFlush(in_stack_ffffffffffffff60);
            goto LAB_002ef18c;
          }
          in_stack_ffffffffffffff60 = (QHttpNetworkConnectionChannel *)(long)iVar6;
          pQVar8 = (QHttpNetworkConnectionChannel *)
                   QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::size
                             ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                              (*(long *)(in_RDI + 0xb8) + (long)iVar3 * 0x108 + 0xb8));
        } while (in_stack_ffffffffffffff60 != pQVar8);
        do {
          bVar2 = QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::isEmpty
                            ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)0x2ef07a
                            );
          if (((bVar2 ^ 0xffU) & 1) == 0) break;
          qVar7 = QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::size
                            ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                             (*(long *)(in_RDI + 0xb8) + (long)iVar3 * 0x108 + 0xb8));
          iVar6 = (int)qVar7;
          fillPipeline(in_RSI,(QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                              CONCAT44(iVar3,CONCAT13(bVar16,CONCAT12(bVar15,CONCAT11(bVar14,bVar13)
                                                                     ))),
                       (QHttpNetworkConnectionChannel *)CONCAT44(iVar6,in_stack_ffffffffffffff78));
          qVar7 = QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::size
                            ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                             (*(long *)(in_RDI + 0xb8) + (long)iVar3 * 0x108 + 0xb8));
          if (2 < qVar7) {
            QHttpNetworkConnectionChannel::pipelineFlush(in_stack_ffffffffffffff60);
            goto LAB_002ef18c;
          }
          qVar7 = QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::size
                            ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                             (*(long *)(in_RDI + 0xb8) + (long)iVar3 * 0x108 + 0xb8));
        } while (iVar6 != qVar7);
        QHttpNetworkConnectionChannel::pipelineFlush(in_stack_ffffffffffffff60);
      }
    }
  }
LAB_002ef18c:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttpNetworkConnectionPrivate::fillPipeline(QIODevice *socket)
{
    // return fast if there is nothing to pipeline
    if (highPriorityQueue.isEmpty() && lowPriorityQueue.isEmpty())
        return;

    int i = indexOf(socket);

    // return fast if there was no reply right now processed
    if (channels[i].reply == nullptr)
        return;

    if (! (defaultPipelineLength - channels[i].alreadyPipelinedRequests.size() >= defaultRePipelineLength)) {
        return;
    }

    if (channels[i].pipeliningSupported != QHttpNetworkConnectionChannel::PipeliningProbablySupported)
        return;

    // the current request that is in must already support pipelining
    if (!channels[i].request.isPipeliningAllowed())
        return;

    // the current request must be a idempotent (right now we only check GET)
    if (channels[i].request.operation() != QHttpNetworkRequest::Get)
        return;

    // check if socket is connected
    if (QSocketAbstraction::socketState(socket) != QAbstractSocket::ConnectedState)
        return;

    // check for resendCurrent
    if (channels[i].resendCurrent)
        return;

    // we do not like authentication stuff
    // ### make sure to be OK with this in later releases
    if (!channels[i].authenticator.isNull()
        && (!channels[i].authenticator.user().isEmpty()
            || !channels[i].authenticator.password().isEmpty()))
        return;
    if (!channels[i].proxyAuthenticator.isNull()
        && (!channels[i].proxyAuthenticator.user().isEmpty()
            || !channels[i].proxyAuthenticator.password().isEmpty()))
        return;

    // must be in ReadingState or WaitingState
    if (! (channels[i].state == QHttpNetworkConnectionChannel::WaitingState
           || channels[i].state == QHttpNetworkConnectionChannel::ReadingState))
        return;

    int lengthBefore;
    while (!highPriorityQueue.isEmpty()) {
        lengthBefore = channels[i].alreadyPipelinedRequests.size();
        fillPipeline(highPriorityQueue, channels[i]);

        if (channels[i].alreadyPipelinedRequests.size() >= defaultPipelineLength) {
            channels[i].pipelineFlush();
            return;
        }

        if (lengthBefore == channels[i].alreadyPipelinedRequests.size())
            break; // did not process anything, now do the low prio queue
    }

    while (!lowPriorityQueue.isEmpty()) {
        lengthBefore = channels[i].alreadyPipelinedRequests.size();
        fillPipeline(lowPriorityQueue, channels[i]);

        if (channels[i].alreadyPipelinedRequests.size() >= defaultPipelineLength) {
            channels[i].pipelineFlush();
            return;
        }

        if (lengthBefore == channels[i].alreadyPipelinedRequests.size())
            break; // did not process anything
    }


    channels[i].pipelineFlush();
}